

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O2

void __thiscall llvm::DataExtractor::skip(DataExtractor *this,Cursor *C,uint64_t Length)

{
  ulong uVar1;
  ErrorAsOutParameter local_18;
  ErrorAsOutParameter ErrAsOut;
  
  local_18.Err = &C->Err;
  uVar1 = (ulong)(C->Err).Payload & 0xfffffffffffffffe;
  (C->Err).Payload = (ErrorInfoBase *)(uVar1 != 0 | uVar1);
  if (uVar1 == 0) {
    uVar1 = C->Offset;
    if ((uVar1 + Length < uVar1) || ((this->Data).Length <= (Length + uVar1) - 1)) {
      unexpectedEndReached(local_18.Err);
    }
    else {
      C->Offset = uVar1 + Length;
    }
  }
  ErrorAsOutParameter::~ErrorAsOutParameter(&local_18);
  return;
}

Assistant:

void DataExtractor::skip(Cursor &C, uint64_t Length) const {
  ErrorAsOutParameter ErrAsOut(&C.Err);
  if (isError(&C.Err))
    return;

  if (isValidOffsetForDataOfSize(C.Offset, Length))
    C.Offset += Length;
  else
    unexpectedEndReached(&C.Err);
}